

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.cpp
# Opt level: O3

unsigned_long_long duckdb_zstd::XXH64(void *input,size_t len,unsigned_long_long seed)

{
  uint *puVar1;
  long lVar2;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar1 = (uint *)((long)input + len);
  if (len < 0x20) {
    lVar2 = seed + 0x27d4eb2f165667c5;
  }
  else {
    lVar2 = seed + 0x60ea27eeadc0b5d6;
    uVar6 = seed + 0xc2b2ae3d27d4eb4f;
    uVar5 = seed + 0x61c8864e7a143579;
    do {
      uVar8 = *input * -0x3d4d51c2d82b14b1 + lVar2;
      uVar9 = uVar8 * 0x80000000 | uVar8 >> 0x21;
      lVar2 = uVar9 * -0x61c8864e7a143579;
      uVar6 = *(long *)((long)input + 8) * -0x3d4d51c2d82b14b1 + uVar6;
      uVar7 = uVar6 * 0x80000000 | uVar6 >> 0x21;
      uVar6 = *(long *)((long)input + 0x10) * -0x3d4d51c2d82b14b1 + seed;
      uVar8 = uVar6 * 0x80000000 | uVar6 >> 0x21;
      uVar6 = uVar7 * -0x61c8864e7a143579;
      seed = uVar8 * -0x61c8864e7a143579;
      uVar5 = *(long *)((long)input + 0x18) * -0x3d4d51c2d82b14b1 + uVar5;
      uVar4 = uVar5 * 0x80000000 | uVar5 >> 0x21;
      uVar5 = uVar4 * -0x61c8864e7a143579;
      input = (void *)((long)input + 0x20);
    } while (input <= puVar1 + -8);
    lVar2 = ((uVar4 * -0x784349ab80000000 | uVar4 * -0x210ca4fef0869357 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar8 * -0x784349ab80000000 | uVar8 * -0x210ca4fef0869357 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar7 * -0x784349ab80000000 | uVar7 * -0x210ca4fef0869357 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar9 * -0x784349ab80000000 | uVar9 * -0x210ca4fef0869357 >> 0x21) *
             -0x61c8864e7a143579 ^
            (uVar4 * -0x1939e850d5e40000 | uVar5 >> 0x2e) +
            (uVar8 * 0x779b185ebca87000 | seed >> 0x34) +
            (uVar7 * 0x1bbcd8c2f5e54380 | uVar6 >> 0x39) +
            (uVar9 * 0x3c6ef3630bd7950e | (ulong)(lVar2 < 0))) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  uVar6 = lVar2 + len;
  puVar3 = (uint *)((long)input + 8);
  while (puVar3 <= puVar1) {
    uVar6 = (*input * -0x6c158a5880000000 | (ulong)(*input * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ uVar6;
    uVar6 = (uVar6 << 0x1b | uVar6 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    puVar3 = (uint *)((long)input + 0x10);
    input = (uint *)((long)input + 8);
  }
  if ((uint *)((long)input + 4) <= puVar1) {
    uVar6 = (ulong)*input * -0x61c8864e7a143579 ^ uVar6;
    uVar6 = (uVar6 << 0x17 | uVar6 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    input = (uint *)((long)input + 4);
  }
  for (; input < puVar1; input = (uint *)((long)input + 1)) {
    uVar6 = (ulong)(byte)*input * 0x27d4eb2f165667c5 ^ uVar6;
    uVar6 = (uVar6 << 0xb | uVar6 >> 0x35) * -0x61c8864e7a143579;
  }
  uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0x3d4d51c2d82b14b1;
  uVar6 = (uVar6 >> 0x1d ^ uVar6) * 0x165667b19e3779f9;
  return uVar6 >> 0x20 ^ uVar6;
}

Assistant:

XXH_PUBLIC_API unsigned long long XXH64 (const void* input, size_t len, unsigned long long seed)
{
#if 0
    /* Simple version, good for code maintenance, but unfortunately slow for small inputs */
    XXH64_CREATESTATE_STATIC(state);
    XXH64_reset(state, seed);
    XXH64_update(state, input, len);
    return XXH64_digest(state);
#else
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if (XXH_FORCE_ALIGN_CHECK) {
        if ((((size_t)input) & 7)==0) {  /* Input is aligned, let's leverage the speed advantage */
            if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
                return XXH64_endian_align(input, len, seed, XXH_littleEndian, XXH_aligned);
            else
                return XXH64_endian_align(input, len, seed, XXH_bigEndian, XXH_aligned);
    }   }

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_endian_align(input, len, seed, XXH_littleEndian, XXH_unaligned);
    else
        return XXH64_endian_align(input, len, seed, XXH_bigEndian, XXH_unaligned);
#endif
}